

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O3

void __thiscall TemporalPhaseDecodingSynapse::update(TemporalPhaseDecodingSynapse *this)

{
  double *pdVar1;
  double *pdVar2;
  Event *pEVar3;
  Population *pPVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  pointer ppEVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  int iVar18;
  double dVar15;
  _func_int **pp_Var16;
  undefined1 auVar17 [16];
  double dVar19;
  undefined1 auVar20 [16];
  int iVar21;
  
  if (0 < this->inputSize) {
    uVar13 = 0;
    do {
      dVar15 = this->currentWindow;
      dVar19 = this->param->window_length_s;
      dVar14 = Clock::getCurrentTime(this->clock);
      auVar7 = _DAT_0010c050;
      auVar6 = _DAT_0010c040;
      uVar8 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      if (dVar15 + dVar19 <= dVar14) {
        if ((long)uVar8 < 0) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        pdVar1 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        if (1 < uVar8) {
          uVar11 = 0;
          do {
            pdVar1[uVar11] = -1.0;
            (pdVar1 + uVar11)[1] = -1.0;
            uVar11 = uVar11 + 2;
          } while (uVar11 < (uVar8 & 0x7ffffffffffffffe));
        }
        if ((long)(uVar8 & 0x7ffffffffffffffe) < (long)uVar8) {
          uVar10 = (uint)uVar8 & 1;
          lVar12 = (ulong)uVar10 - 1;
          auVar17._8_4_ = (int)lVar12;
          auVar17._0_8_ = lVar12;
          auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar17 = auVar17 ^ auVar7;
          uVar11 = 0;
          do {
            auVar20._8_4_ = (int)uVar11;
            auVar20._0_8_ = uVar11;
            auVar20._12_4_ = (int)(uVar11 >> 0x20);
            auVar20 = (auVar20 | auVar6) ^ auVar7;
            bVar5 = auVar17._0_4_ < auVar20._0_4_;
            iVar18 = auVar17._4_4_;
            iVar21 = auVar20._4_4_;
            if ((bool)(~(iVar18 < iVar21 || iVar21 == iVar18 && bVar5) & 1)) {
              pdVar1[(uVar8 & 0xfffffffffffffffe) + uVar11] = -1.0;
            }
            if (iVar18 >= iVar21 && (iVar21 != iVar18 || !bVar5)) {
              pdVar1[(uVar8 & 0xfffffffffffffffe) + uVar11 + 1] = -1.0;
            }
            uVar11 = uVar11 + 2;
          } while ((uVar10 + 1 & 0xfffffffe) != uVar11);
        }
        uVar8 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        this->currentWindow = this->param->window_length_s + this->currentWindow;
      }
      if (0 < (long)uVar8) {
        lVar12 = 0;
        do {
          pdVar2 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pdVar1 = pdVar2 + lVar12;
          if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
            ppEVar9 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            ppEVar9 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pEVar3 = (((this->super_Synapse).from_population)->output).
                     super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            if (pEVar3->type == Spike) {
              dVar19 = (double)this->param->som_frequency;
              dVar15 = round((((pEVar3->eventTime - this->currentWindow) - this->phaseOffset) /
                             this->param->window_length_s) * dVar19);
              pp_Var16 = (_func_int **)((dVar15 / dVar19 + -0.1) * 1.25);
              pdVar2[lVar12] = (double)pp_Var16;
              ppEVar9[uVar13][1]._vptr_Event = pp_Var16;
            }
          }
          pPVar4 = (this->super_Synapse).to_population;
          (*pPVar4->_vptr_Population[5])(pPVar4,uVar13 & 0xffffffff,ppEVar9[uVar13]);
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->spikeTimes).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
      }
      Logging::logValue(this->logger,(long)this,(int)uVar13,3,
                        (double)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13][1]._vptr_Event);
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)this->inputSize);
  }
  return;
}

Assistant:

void TemporalPhaseDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
            spikeTimes.setConstant(-1);
            currentWindow += param->window_length_s;
        }
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) < 0 && from_population->output[i]->type == EventType::Spike) {
                
                double s0 = from_population->output[i]->eventTime - currentWindow - phaseOffset;
                s0 = round(s0/param->window_length_s*param->som_frequency);
                spikeTimes(j) = s0 * 1 / (param->som_frequency);
                spikeTimes(j) = (spikeTimes(j) - 0.1) * 1.25;

                static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(j));
            } 
            to_population->setInput(i, output[i]);
        }
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}